

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O0

string * ApprovalTests::HelpMessages::getUnknownEnvVarReporterHelp
                   (string *envVarName,string *selected,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *knowns)

{
  string *in_RDI;
  string helpMessage;
  string *in_stack_000002e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000002e8;
  string *in_stack_000002f0;
  string *in_stack_000002f8;
  allocator local_41;
  string local_40 [64];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_40,
             "* The environment variable [envVarName] contains the value\n* [selected]\n*\n* This reporter is not recognised.\n*\n* Please unset the environment value, or change it to refer to one of the\n* known reporters:\n*\n[known]*\n* For more information, see:\n* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/how_tos/SelectReporterWithEnvironmentVariable.md\n"
             ,&local_41);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  envVarErrorMessage(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  ::std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string
    HelpMessages::getUnknownEnvVarReporterHelp(const std::string& envVarName,
                                               const std::string& selected,
                                               const std::vector<std::string>& knowns)
    {
        std::string helpMessage =
            R"(* The environment variable [envVarName] contains the value
* [selected]
*
* This reporter is not recognised.
*
* Please unset the environment value, or change it to refer to one of the
* known reporters:
*
[known]*
* For more information, see:
* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/how_tos/SelectReporterWithEnvironmentVariable.md
)";

        return envVarErrorMessage(envVarName, selected, knowns, helpMessage);
    }